

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O0

Client * __thiscall
capnp::DynamicCapability::Client::upcast
          (Client *__return_storage_ptr__,Client *this,InterfaceSchema requestedSchema)

{
  bool bVar1;
  ClientHook *pCVar2;
  Own<capnp::ClientHook,_std::nullptr_t> local_60;
  Schema local_50;
  Fault local_38;
  Fault f;
  bool local_22;
  DebugExpression<bool> local_21;
  Client *pCStack_20;
  DebugExpression<bool> _kjCondition;
  Client *this_local;
  InterfaceSchema requestedSchema_local;
  
  f.exception = (Exception *)requestedSchema.super_Schema.raw;
  pCStack_20 = this;
  local_22 = InterfaceSchema::extends(&this->schema,requestedSchema);
  local_21 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_22);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_21);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
               ,0x1e,FAILED,"schema.extends(requestedSchema)",
               "_kjCondition,\"Can\'t upcast to non-superclass.\"",&local_21,
               (char (*) [32])"Can\'t upcast to non-superclass.");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  local_50 = requestedSchema.super_Schema.raw;
  pCVar2 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                     ((Own<capnp::ClientHook,_std::nullptr_t> *)this);
  (*pCVar2->_vptr_ClientHook[4])();
  Client(__return_storage_ptr__,(InterfaceSchema)local_50.raw,&local_60);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_60);
  return __return_storage_ptr__;
}

Assistant:

DynamicCapability::Client DynamicCapability::Client::upcast(InterfaceSchema requestedSchema) {
  KJ_REQUIRE(schema.extends(requestedSchema), "Can't upcast to non-superclass.") {}
  return DynamicCapability::Client(requestedSchema, hook->addRef());
}